

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void icetSingleImageCollect
               (IceTSparseImage input_image,IceTInt dest,IceTSizeType piece_offset,
               IceTImage result_image)

{
  int iVar1;
  uint uVar2;
  IceTEnum IVar3;
  IceTEnum IVar4;
  IceTSizeType *recvoffsets;
  IceTSizeType *recvcounts;
  IceTImage image;
  IceTVoid *pIVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  IceTSizeType IVar9;
  IceTSizeType *recvcounts_00;
  IceTSizeType *recvoffsets_00;
  IceTSizeType color_size;
  IceTSizeType piece_offset_local;
  int local_98;
  IceTSizeType piece_size;
  IceTImage local_90;
  IceTSizeType depth_size;
  ulong local_80;
  IceTByte dummy_buffer [64];
  
  color_size = 1;
  recvcounts = (IceTSizeType *)0x0;
  piece_offset_local = piece_offset;
  local_90.opaque_internals = result_image.opaque_internals;
  depth_size = color_size;
  iVar1 = icetCommRank();
  uVar2 = icetCommSize();
  piece_size = icetSparseImageGetNumPixels(input_image);
  local_98 = iVar1;
  local_80 = (ulong)uVar2;
  if (iVar1 == dest) {
    recvoffsets = (IceTSizeType *)icetGetStateBuffer(0x186,uVar2 * 4);
    recvcounts = (IceTSizeType *)icetGetStateBuffer(0x187,uVar2 * 4);
  }
  else {
    recvoffsets = (IceTSizeType *)0x0;
  }
  icetCommGather(&piece_offset_local,1,0x8003,recvoffsets,dest);
  icetCommGather(&piece_size,1,0x8003,recvcounts,dest);
  image.opaque_internals = local_90.opaque_internals;
  if (piece_size < 1) {
    if (local_98 != dest) {
      IVar9 = icetImageBufferSize(0,0);
      if (0x40 < IVar9) {
        icetRaiseDiagnostic("Oops.  My dummy buffer is not big enough.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/common.c"
                            ,0x200);
        return;
      }
      image = icetImageAssignBuffer(dummy_buffer,0,0);
    }
  }
  else {
    icetDecompressSubImage(input_image,piece_offset_local,local_90);
  }
  icetImageAdjustForOutput(image);
  icetTimingCollectBegin();
  IVar3 = icetImageGetColorFormat(image);
  IVar4 = icetImageGetDepthFormat(image);
  local_90.opaque_internals = (IceTVoid *)(long)dest;
  if (IVar3 != 0xc000) {
    pIVar5 = icetImageGetColorVoid(image,&color_size);
    if (local_98 == dest) {
      uVar6 = 0;
      uVar8 = 0;
      if (0 < (int)local_80) {
        uVar8 = local_80 & 0xffffffff;
      }
      for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
        recvoffsets[uVar6] = recvoffsets[uVar6] * color_size;
        recvcounts[uVar6] = color_size * recvcounts[uVar6];
      }
      IVar9 = recvcounts[(long)local_90.opaque_internals];
      pvVar7 = (void *)0xffffffffffffffff;
      recvcounts_00 = recvcounts;
      recvoffsets_00 = recvoffsets;
    }
    else {
      pvVar7 = (void *)((long)pIVar5 + (long)piece_offset_local * (long)color_size);
      IVar9 = piece_size * color_size;
      pIVar5 = (void *)0x0;
      recvcounts_00 = (IceTSizeType *)0x0;
      recvoffsets_00 = (IceTSizeType *)0x0;
    }
    icetCommGatherv(pvVar7,IVar9,0x8001,pIVar5,recvcounts_00,recvoffsets_00,dest);
  }
  if (IVar4 != 0xd000) {
    pIVar5 = icetImageGetDepthVoid(image,&depth_size);
    if (local_98 == dest) {
      if (color_size != depth_size) {
        uVar8 = 0;
        uVar6 = local_80 & 0xffffffff;
        if ((int)local_80 < 1) {
          uVar6 = uVar8;
        }
        for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          recvoffsets[uVar8] = (recvoffsets[uVar8] / color_size) * depth_size;
          recvcounts[uVar8] = (recvcounts[uVar8] / color_size) * depth_size;
        }
      }
      IVar9 = recvcounts[(long)local_90.opaque_internals];
      pvVar7 = (void *)0xffffffffffffffff;
    }
    else {
      pvVar7 = (void *)((long)pIVar5 + (long)piece_offset_local * (long)depth_size);
      IVar9 = piece_size * depth_size;
      pIVar5 = (void *)0x0;
      recvcounts = (IceTSizeType *)0x0;
      recvoffsets = (IceTSizeType *)0x0;
    }
    icetCommGatherv(pvVar7,IVar9,0x8001,pIVar5,recvcounts,recvoffsets,dest);
  }
  icetTimingCollectEnd();
  return;
}

Assistant:

void icetSingleImageCollect(const IceTSparseImage input_image,
                            IceTInt dest,
                            IceTSizeType piece_offset,
                            IceTImage result_image)
{
    IceTSizeType *offsets;
    IceTSizeType *sizes;
    IceTInt rank;
    IceTInt numproc;

    IceTSizeType piece_size;

    IceTEnum color_format;
    IceTEnum depth_format;
    IceTSizeType color_size = 1;
    IceTSizeType depth_size = 1;

#define DUMMY_BUFFER_SIZE       ((IceTSizeType)(16*sizeof(IceTInt)))
    IceTByte dummy_buffer[DUMMY_BUFFER_SIZE];

    rank = icetCommRank();
    numproc = icetCommSize();

    /* Collect partitions held by each process. */
    piece_size = icetSparseImageGetNumPixels(input_image);
    if (rank == dest) {
        offsets = icetGetStateBuffer(ICET_IMAGE_COLLECT_OFFSET_BUF,
                                     sizeof(IceTSizeType)*numproc);
        sizes = icetGetStateBuffer(ICET_IMAGE_COLLECT_SIZE_BUF,
                                   sizeof(IceTSizeType)*numproc);
    } else {
        offsets = NULL;
        sizes = NULL;
    }
    /* Technically, these gathers are part of the collection process and should
       therefore be timed.  However, unless the compositing is very well load
       balanced (and typically it is not), different processes will arrive here
       at different times.  These gathers act something like a barrier that
       helps separate the time spent collecting final pixels from the time spent
       in transferring and compositing fragments. */
    icetCommGather(&piece_offset, 1, ICET_SIZE_TYPE, offsets, dest);
    icetCommGather(&piece_size, 1, ICET_SIZE_TYPE, sizes, dest);

#ifdef DEBUG
    if (rank == dest) {
        IceTVoid *data;
        IceTSizeType size;
        if (icetImageGetColorFormat(result_image) != ICET_IMAGE_COLOR_NONE) {
            data = icetImageGetColorVoid(result_image, &size);
            memset(data, 0xCD, icetImageGetNumPixels(result_image)*size);
        }
        if (icetImageGetDepthFormat(result_image) != ICET_IMAGE_DEPTH_NONE) {
            data = icetImageGetDepthVoid(result_image, &size);
            memset(data, 0xCD, icetImageGetNumPixels(result_image)*size);
        }
    }
#endif

    if (piece_size > 0) {
        /* Decompress data into appropriate offset of result image. */
        icetDecompressSubImage(input_image, piece_offset, result_image);
    } else if (rank != dest) {
        /* If this function is called for multiple collections, it is likely
           that the local process will not have data for all collections.  To
           prevent making the calling function allocate an image buffer when it
           is neither sending or receiving data, just allocate a dummy buffer to
           satisfy the following code. */
        if (DUMMY_BUFFER_SIZE < icetImageBufferSize(0, 0)) {
            icetRaiseError("Oops.  My dummy buffer is not big enough.",
                           ICET_SANITY_CHECK_FAIL);
            return;
        }
        result_image = icetImageAssignBuffer(dummy_buffer, 0, 0);
    } else {
        /* Collecting data at empty process.  We still want to use the provided
           result_image, but we have nothing of our own to put in it.  Thus, do
           nothing. */
    }

    /* Adjust image for output as some buffers, such as depth, might be
       dropped. */
    icetImageAdjustForOutput(result_image);

    icetTimingCollectBegin();

    color_format = icetImageGetColorFormat(result_image);
    depth_format = icetImageGetDepthFormat(result_image);

    if (color_format != ICET_IMAGE_COLOR_NONE) {
        /* Use IceTByte for byte-based pointer arithmetic. */
        IceTByte *color_buffer
          = icetImageGetColorVoid(result_image, &color_size);
        int proc;

        if (rank == dest) {
            /* Adjust sizes and offsets to sizes of pixel colors. */
            for (proc = 0; proc < numproc; proc++) {
                offsets[proc] *= color_size;
                sizes[proc] *= color_size;
            }
            icetCommGatherv(ICET_IN_PLACE_COLLECT,
                            sizes[rank],
                            ICET_BYTE,
                            color_buffer,
                            sizes,
                            offsets,
                            dest);
        } else {
            icetCommGatherv(color_buffer + piece_offset * color_size,
                            piece_size * color_size,
                            ICET_BYTE,
                            NULL,
                            NULL,
                            NULL,
                            dest);
        }
    }

    if (depth_format != ICET_IMAGE_DEPTH_NONE) {
        /* Use IceTByte for byte-based pointer arithmetic. */
        IceTByte *depth_buffer
          = icetImageGetDepthVoid(result_image, &depth_size);
        int proc;

        if (rank == dest) {
            /* Adjust sizes and offsets to sizes of pixel depths.  Also
               adjust for any adjustments made for color. */
            if (color_size != depth_size) {
                for (proc = 0; proc < numproc; proc++) {
                    offsets[proc] /= color_size;
                    offsets[proc] *= depth_size;
                    sizes[proc] /= color_size;
                    sizes[proc] *= depth_size;
                }
            }
            icetCommGatherv(ICET_IN_PLACE_COLLECT,
                            sizes[rank],
                            ICET_BYTE,
                            depth_buffer,
                            sizes,
                            offsets,
                            dest);
        } else {
            icetCommGatherv(depth_buffer + piece_offset * depth_size,
                            piece_size * depth_size,
                            ICET_BYTE,
                            NULL,
                            NULL,
                            NULL,
                            dest);
        }
    }

    icetTimingCollectEnd();
}